

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_sum_suite.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  
  sum_null();
  sum_boolean();
  sum_integer();
  sum_real();
  sum_string();
  sum_array_null();
  sum_array_boolean();
  sum_array_integer();
  sum_array_real();
  sum_array_string();
  fail_array_string();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    sum_null();
    sum_boolean();
    sum_integer();
    sum_real();
    sum_string();
    sum_array_null();
    sum_array_boolean();
    sum_array_integer();
    sum_array_real();
    sum_array_string();
    fail_array_string();

    return boost::report_errors();
}